

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deleteRedundantCasts.cpp
# Opt level: O3

Expr * __thiscall RedundantCastsVisitor::simplify(RedundantCastsVisitor *this,Expr *expr)

{
  bool bVar1;
  Expr *expr_00;
  
  if (expr != (Expr *)0x0) {
    bVar1 = CastExpr::classof(expr);
    if (bVar1) {
      for (expr_00 = *(Expr **)&expr[1].kind; expr_00 != (Expr *)0x0;
          expr_00 = *(Expr **)&expr_00[1].kind) {
        bVar1 = CastExpr::classof(expr_00);
        if (!bVar1) goto LAB_00157004;
      }
      expr_00 = (Expr *)0x0;
LAB_00157004:
      *(Expr **)&expr[1].kind = expr_00;
    }
  }
  return expr;
}

Assistant:

Expr* RedundantCastsVisitor::simplify(Expr* expr) {
    if (auto* cast = llvm::dyn_cast_or_null<CastExpr>(expr)) {
        Expr* innermost = cast->expr;

        while (auto* inner = llvm::dyn_cast_or_null<CastExpr>(innermost)) {
            innermost = inner->expr;
        }

        cast->expr = innermost;
    }

    return expr;
}